

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O3

JSONNode * __thiscall JSONNode::at_nocase(JSONNode *this,json_string *name_t)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uchar uVar2;
  internalJSONNode *piVar3;
  JSONNode **ppJVar4;
  out_of_range *this_00;
  string *psVar5;
  json_string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  piVar3 = this->internal;
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"no internal","");
  JSONDebug::_JSON_ASSERT(piVar3 != (internalJSONNode *)0x0,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68.field_2._M_allocated_capacity._0_7_ = 0x65746e69206f6e;
  local_68.field_2._7_4_ = 0x6c616e72;
  local_68._M_string_length = 0xb;
  local_68.field_2._M_local_buf[0xb] = '\0';
  local_68._M_dataplus._M_p = (pointer)paVar1;
  JSONDebug::_JSON_ASSERT(this->internal != (internalJSONNode *)0x0,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  uVar2 = this->internal->_type;
  if (jsonSingletonERROR_NON_ITERATABLE::getValue[abi:cxx11]()::single == '\0') {
    at_nocase();
  }
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,jsonSingletonERROR_NON_ITERATABLE::getValue[abi:cxx11]()::single,
             DAT_00126388 + jsonSingletonERROR_NON_ITERATABLE::getValue[abi:cxx11]()::single);
  std::__cxx11::string::append((char *)&local_68);
  JSONDebug::_JSON_ASSERT(uVar2 == '\x05',&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  ppJVar4 = internalJSONNode::at_nocase(this->internal,name_t);
  if (ppJVar4 != (JSONNode **)0x0) {
    return *ppJVar4;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"at_nocase const could not find child by name: ","");
  std::operator+(&local_68,&local_48,name_t);
  JSONDebug::_JSON_FAIL(&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  psVar5 = jsonSingletonEMPTY_STD_STRING::getValue_abi_cxx11_();
  std::out_of_range::out_of_range(this_00,(string *)psVar5);
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

json_throws(std::out_of_range) {
	   JSON_CHECK_INTERNAL();
	   JSON_ASSERT(type() == JSON_NODE, json_global(ERROR_NON_ITERATABLE) + JSON_TEXT("at_nocase"));
	   if (JSONNode ** res = internal -> at_nocase(name_t)){
		  return *(*res);
	   }
	   JSON_FAIL(json_string(JSON_TEXT("at_nocase const could not find child by name: ")) + name_t);
	   json_throw(std::out_of_range(json_global(EMPTY_STD_STRING)));
    }